

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::Var::handle_name_abi_cxx11_(string *__return_storage_ptr__,Var *this,Generator *scope)

{
  int iVar1;
  long lVar2;
  VarException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_e0;
  string local_c0;
  Var *local_a0;
  Generator *local_98;
  undefined8 local_90;
  string local_88 [8];
  string var_name;
  string gen_name;
  allocator_type local_21;
  
  Generator::handle_name_abi_cxx11_((string *)((long)&var_name.field_2 + 8),scope);
  (*(this->super_IRNode)._vptr_IRNode[0x20])(local_88,this);
  lVar2 = std::__cxx11::string::find(local_88,(ulong)((long)&var_name.field_2 + 8));
  if (lVar2 == 0) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)(var_name.field_2._M_local_buf + 8));
    return __return_storage_ptr__;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  Generator::handle_name_abi_cxx11_(&local_c0,(Generator *)CONCAT44(extraout_var,iVar1));
  gen_name.field_2._8_8_ = var_name.field_2._8_8_;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} is not accessible from {1}");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)((long)&gen_name.field_2 + 8);
  fmt::v7::detail::vformat_abi_cxx11_(&local_e0,(detail *)bVar3.data_,format_str,args);
  local_a0 = this;
  local_98 = scope;
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  local_90 = CONCAT44(extraout_var_00,iVar1);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_a0;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
             ((long)&gen_name.field_2 + 8),__l,&local_21);
  VarException::VarException
            (this_00,&local_e0,
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
             ((long)&gen_name.field_2 + 8));
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Var::handle_name(kratos::Generator *scope) const {
    // subtract the scope
    auto gen_name = scope->handle_name();
    auto var_name = handle_name();
    auto pos = var_name.find(gen_name);
    if (pos != 0) {
        throw VarException(
            ::format("{0} is not accessible from {1}", gen_name, generator()->handle_name()),
            {this, scope, this->generator()});
    }
    // we +1 because there is a dot there
    return var_name.substr(pos + gen_name.size() + 1);
}